

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::CordInputStream::BackUp(CordInputStream *this,int count)

{
  CordInputStream *pCVar1;
  ulong skip;
  CordInputStream *this_00;
  
  this_00 = (CordInputStream *)(long)count;
  pCVar1 = (CordInputStream *)(this->size_ - this->available_);
  if (this_00 <= pCVar1) {
    this->available_ =
         (size_t)((this_00->it_).chunk_iterator_.btree_reader_.navigator_.index_ +
                 (this->available_ - 0x34));
    this->bytes_remaining_ =
         (size_t)((this_00->it_).chunk_iterator_.btree_reader_.navigator_.index_ +
                 (this->bytes_remaining_ - 0x34));
    return;
  }
  BackUp();
  skip = (ulong)(int)pCVar1;
  if (this_00->available_ < skip) {
    if (this_00->bytes_remaining_ < skip) {
      NextChunk(this_00,this_00->bytes_remaining_);
    }
    else {
      NextChunk(this_00,skip);
    }
    return;
  }
  this_00->available_ = this_00->available_ - skip;
  this_00->bytes_remaining_ = this_00->bytes_remaining_ - skip;
  return;
}

Assistant:

void CordInputStream::BackUp(int count) {
  // Backup is only allowed on last returned chunk from `Next()`.
  ABSL_CHECK_LE(static_cast<size_t>(count), size_ - available_);

  available_ += count;
  bytes_remaining_ += count;
}